

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.h
# Opt level: O2

MediumHandle __thiscall pbrt::Interaction::GetMedium(Interaction *this,Vector3f *w)

{
  long lVar1;
  float fVar2;
  Vector3f *pVVar3;
  Vector3<float> *in_RDX;
  type tVar4;
  
  lVar1._0_4_ = w[5].super_Tuple3<pbrt::Vector3,_float>.y;
  lVar1._4_4_ = w[5].super_Tuple3<pbrt::Vector3,_float>.z;
  if (lVar1 == 0) {
    pVVar3 = w + 6;
  }
  else {
    tVar4 = Dot<float>(in_RDX,(Normal3<float> *)&w[3].super_Tuple3<pbrt::Vector3,_float>.y);
    pVVar3 = (Vector3f *)
             ((ulong)(0.0 < tVar4) * 8 + *(long *)&w[5].super_Tuple3<pbrt::Vector3,_float>.y);
  }
  fVar2 = (pVVar3->super_Tuple3<pbrt::Vector3,_float>).y;
  (this->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low =
       (pVVar3->super_Tuple3<pbrt::Vector3,_float>).x;
  (this->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high = fVar2;
  return (MediumHandle)
         (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          )this;
}

Assistant:

GetMedium(const Vector3f &w) const {
        if (mediumInterface != nullptr)
            return Dot(w, n) > 0 ? mediumInterface->outside : mediumInterface->inside;
        return medium;
    }